

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O2

void __thiscall GrammarToken::set(GrammarToken *this,uint4 tp,char *ptr,int4 len)

{
  char cVar1;
  string *psVar2;
  LowlevelError *this_00;
  intb val;
  string charstring;
  istringstream s;
  uint auStack_188 [90];
  
  this->type = tp;
  if (tp - 0x105 < 2) {
    psVar2 = (string *)operator_new(0x20);
    (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar2,ptr,ptr + len);
    (this->value).stringval = psVar2;
    return;
  }
  if (tp != 0x104) {
    if (tp == 0x103) {
      charstring._M_dataplus._M_p = (pointer)&charstring.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&charstring,ptr,ptr + len);
      std::__cxx11::istringstream::istringstream((istringstream *)&s,(string *)&charstring,_S_in);
      *(uint *)((long)auStack_188 + *(long *)(_s + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(_s + -0x18)) & 0xffffffb5;
      std::istream::_M_extract<long>((long *)&s);
      (this->value).integer = val;
      std::__cxx11::istringstream::~istringstream((istringstream *)&s);
      std::__cxx11::string::~string((string *)&charstring);
      return;
    }
    this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)&s,"Bad internal grammar token set",(allocator *)&charstring);
    LowlevelError::LowlevelError(this_00,(string *)&s);
    __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  if (len == 1) {
    cVar1 = *ptr;
LAB_00357e39:
    this->value = (tokenvalue)(long)cVar1;
  }
  else {
    cVar1 = ptr[1];
    switch(cVar1) {
    case 'n':
      (this->value).integer = 10;
      break;
    case 'r':
      (this->value).integer = 0xd;
      break;
    case 't':
      (this->value).integer = 9;
      break;
    case 'v':
      (this->value).integer = 0xb;
      break;
    default:
      if (cVar1 == '0') {
        (this->value).integer = 0;
        return;
      }
      if (cVar1 == 'a') {
        (this->value).integer = 7;
        return;
      }
      if (cVar1 == 'b') {
        (this->value).integer = 8;
        return;
      }
      if (cVar1 == 'f') {
        (this->value).integer = 0xc;
        return;
      }
    case 'o':
    case 'p':
    case 'q':
    case 's':
    case 'u':
      goto LAB_00357e39;
    }
  }
  return;
}

Assistant:

void GrammarToken::set(uint4 tp,char *ptr,int4 len)

{
  type = tp;
  switch(tp) {
  case integer:
    {
      string charstring(ptr,len);
      istringstream s(charstring);
      s.unsetf(ios::dec | ios::hex | ios::oct);
      intb val;
      s >> val;
      value.integer = (uintb)val;
    }
    break;
  case identifier:
  case stringval:
    value.stringval = new string(ptr,len);
    break;
  case charconstant:
    if (len==1)
      value.integer = (uintb)*ptr;
    else {			// Backslash
      switch(ptr[1]) {
      case 'n':
	value.integer = 10;
	break;
      case '0':
	value.integer = 0;
	break;
      case 'a':
	value.integer = 7;
	break;
      case 'b':
	value.integer = 8;
	break;
      case 't':
	value.integer = 9;
	break;
      case 'v':
	value.integer = 11;
	break;
      case 'f':
	value.integer = 12;
	break;
      case 'r':
	value.integer = 13;
	break;
      default:
	value.integer = (uintb)ptr[1];
	break;
      }
    }
    break;
  default:
    throw LowlevelError("Bad internal grammar token set");
  }
}